

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# virtualfileentry.cpp
# Opt level: O0

VirtualPage * __thiscall
sai::VirtualFileEntry::GetTablePage
          (VirtualPage *__return_storage_ptr__,VirtualFileEntry *this,size_t Index)

{
  bool bVar1;
  element_type *peVar2;
  size_t sVar3;
  pointer pvVar4;
  undefined1 local_28 [8];
  shared_ptr<sai::ifstream> Stream;
  size_t Index_local;
  VirtualFileEntry *this_local;
  
  Stream.super___shared_ptr<sai::ifstream,_(__gnu_cxx::_Lock_policy)2>._M_refcount._M_pi =
       (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)Index;
  memset(__return_storage_ptr__,0,0x1000);
  std::weak_ptr<sai::ifstream>::lock((weak_ptr<sai::ifstream> *)local_28);
  bVar1 = std::__shared_ptr::operator_cast_to_bool((__shared_ptr *)local_28);
  if (bVar1) {
    peVar2 = std::__shared_ptr_access<sai::ifstream,_(__gnu_cxx::_Lock_policy)2,_false,_false>::
             operator->((__shared_ptr_access<sai::ifstream,_(__gnu_cxx::_Lock_policy)2,_false,_false>
                         *)local_28);
    sVar3 = VirtualPage::NearestTableIndex
                      ((size_t)Stream.super___shared_ptr<sai::ifstream,_(__gnu_cxx::_Lock_policy)2>.
                               _M_refcount._M_pi);
    std::istream::seekg((long)peVar2,(_Ios_Seekdir)(sVar3 << 0xc));
    peVar2 = std::__shared_ptr_access<sai::ifstream,_(__gnu_cxx::_Lock_policy)2,_false,_false>::
             operator->((__shared_ptr_access<sai::ifstream,_(__gnu_cxx::_Lock_policy)2,_false,_false>
                         *)local_28);
    pvVar4 = std::array<unsigned_char,_4096UL>::data(&__return_storage_ptr__->u8);
    std::istream::read((char *)peVar2,(long)pvVar4);
  }
  std::shared_ptr<sai::ifstream>::~shared_ptr((shared_ptr<sai::ifstream> *)local_28);
  return __return_storage_ptr__;
}

Assistant:

VirtualPage VirtualFileEntry::GetTablePage(std::size_t Index) const
{
	VirtualPage TablePage = {};
	if( std::shared_ptr<ifstream> Stream = FileStream.lock() )
	{
		Stream->seekg(VirtualPage::NearestTableIndex(Index) * VirtualPage::PageSize, std::ios::beg);
		Stream->read(reinterpret_cast<char*>(TablePage.u8.data()), VirtualPage::PageSize);
	}
	return TablePage;
}